

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerSRGBDecodeCase::test
          (SamplerSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  bool bVar3;
  GLenum GVar4;
  long *plVar5;
  size_type *psVar6;
  TesterType TVar7;
  ulong uVar8;
  undefined8 uVar9;
  ScopedLogSection section;
  GLint decodeInt;
  ScopedLogSection section_1;
  GLfloat decodeFloat;
  ScopedLogSection local_f8;
  long local_f0;
  TestLog local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  string local_78;
  GLuint local_54;
  ScopedLogSection local_50;
  code *local_48;
  GLenum local_40;
  GLfloat local_34;
  
  TVar7 = (this->super_SamplerTest).m_tester;
  bVar3 = isPureIntTester(TVar7);
  if ((!bVar3) && (bVar3 = isPureUintTester(TVar7), !bVar3)) {
    pTVar2 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Initial","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_f8,pTVar2,&local_78,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
    tcu::TestLog::endSection(local_f8.m_log);
  }
  pTVar2 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Toggle","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Toggle","");
  tcu::ScopedLogSection::ScopedLogSection(&local_50,pTVar2,&local_78,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_54 = 0x8a49;
  local_34 = 35401.0;
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48 = glu::getErrorName;
    local_40 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < local_b8._M_string_length + local_90) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar9 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_0184076d;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_0184076d:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_f8.m_log = &local_e8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_e8.m_log = pTVar2->m_log;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8.m_log = pTVar2->m_log;
      local_f8.m_log = (TestLog *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_log != &local_e8) {
      operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameteriv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
             (GLint *)&local_54);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48 = glu::getErrorName;
    local_40 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < local_b8._M_string_length + local_90) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar9 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_018409e9;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_018409e9:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_f8.m_log = &local_e8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_e8.m_log = pTVar2->m_log;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8.m_log = pTVar2->m_log;
      local_f8.m_log = (TestLog *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_log != &local_e8) {
      operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterf
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,35402.0);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48 = glu::getErrorName;
    local_40 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < local_b8._M_string_length + local_90) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar9 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_01840c65;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_01840c65:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_f8.m_log = &local_e8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_e8.m_log = pTVar2->m_log;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8.m_log = pTVar2->m_log;
      local_f8.m_log = (TestLog *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_log != &local_e8) {
      operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterfv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_34);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48 = glu::getErrorName;
    local_40 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < local_b8._M_string_length + local_90) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar9 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_01840ee1;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_01840ee1:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_f8.m_log = &local_e8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_e8.m_log = pTVar2->m_log;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8.m_log = pTVar2->m_log;
      local_f8.m_log = (TestLog *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_log != &local_e8) {
      operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  tcu::TestLog::endSection((TestLog *)CONCAT44(local_50.m_log._4_4_,local_50.m_log._0_4_));
  TVar7 = (this->super_SamplerTest).m_tester;
  bVar3 = isPureIntTester(TVar7);
  if (bVar3) {
    local_50.m_log._0_4_ = 0x8a4a;
    local_54 = 0x8a49;
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&local_50);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
      local_48 = glu::getErrorName;
      local_40 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
      uVar8 = 0xf;
      if (local_98 != local_88) {
        uVar8 = local_88[0];
      }
      if (uVar8 < local_b8._M_string_length + local_90) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar9 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_0184118e;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_0184118e:
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
      }
      local_f8.m_log = &local_e8;
      pTVar2 = (TestLog *)(plVar5 + 2);
      if ((TestLog *)*plVar5 == pTVar2) {
        local_e8.m_log = pTVar2->m_log;
        lStack_e0 = plVar5[3];
      }
      else {
        local_e8.m_log = pTVar2->m_log;
        local_f8.m_log = (TestLog *)*plVar5;
      }
      local_f0 = plVar5[1];
      *plVar5 = (long)pTVar2;
      plVar5[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_d8.field_2._M_allocated_capacity = *psVar6;
        local_d8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar6;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78.field_2._8_8_ = plVar5[3];
        local_78._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_78._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_f8.m_log != &local_e8) {
        operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a
               ,(this->super_SamplerTest).m_type);
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&local_54);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 != 0) {
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
      local_48 = glu::getErrorName;
      local_40 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
      uVar8 = 0xf;
      if (local_98 != local_88) {
        uVar8 = local_88[0];
      }
      if (uVar8 < local_b8._M_string_length + local_90) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar9 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_0184140a;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_0184140a:
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
      }
      local_f8.m_log = &local_e8;
      pTVar2 = (TestLog *)(plVar5 + 2);
      if ((TestLog *)*plVar5 == pTVar2) {
        local_e8.m_log = pTVar2->m_log;
        lStack_e0 = plVar5[3];
      }
      else {
        local_e8.m_log = pTVar2->m_log;
        local_f8.m_log = (TestLog *)*plVar5;
      }
      local_f0 = plVar5[1];
      *plVar5 = (long)pTVar2;
      plVar5[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_d8.field_2._M_allocated_capacity = *psVar6;
        local_d8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar6;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78.field_2._8_8_ = plVar5[3];
        local_78._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_78._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_f8.m_log != &local_e8) {
        operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
    TVar7 = (this->super_SamplerTest).m_tester;
  }
  bVar3 = isPureUintTester(TVar7);
  if (!bVar3) {
    return;
  }
  local_50.m_log._0_4_ = 0x8a4a;
  local_54 = 0x8a49;
  glu::CallLogWrapper::glSamplerParameterIuiv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
             (GLuint *)&local_50);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 != 0) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48 = glu::getErrorName;
    local_40 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < local_b8._M_string_length + local_90) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar9 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_018416aa;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_018416aa:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_f8.m_log = &local_e8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_e8.m_log = pTVar2->m_log;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8.m_log = pTVar2->m_log;
      local_f8.m_log = (TestLog *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_log != &local_e8) {
      operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterIuiv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_54);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 == 0) goto LAB_01841acc;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
  local_48 = glu::getErrorName;
  local_40 = GVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
  uVar8 = 0xf;
  if (local_98 != local_88) {
    uVar8 = local_88[0];
  }
  if (uVar8 < local_b8._M_string_length + local_90) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar9 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_b8._M_string_length + local_90) goto LAB_01841926;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_01841926:
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
  }
  local_f8.m_log = &local_e8;
  pTVar2 = (TestLog *)(plVar5 + 2);
  if ((TestLog *)*plVar5 == pTVar2) {
    local_e8.m_log = pTVar2->m_log;
    lStack_e0 = plVar5[3];
  }
  else {
    local_e8.m_log = pTVar2->m_log;
    local_f8.m_log = (TestLog *)*plVar5;
  }
  local_f0 = plVar5[1];
  *plVar5 = (long)pTVar2;
  plVar5[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78.field_2._8_8_ = plVar5[3];
    local_78._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_78._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.m_log != &local_e8) {
    operator_delete(local_f8.m_log,(ulong)((long)&(local_e8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_01841acc:
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  return;
}

Assistant:

void SamplerSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glSamplerParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glSamplerParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}